

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToHoursOperator::Operation<long,duckdb::interval_t>(long input)

{
  interval_t iVar1;
  bool bVar2;
  long value;
  string *in_RDI;
  interval_t result;
  allocator local_39;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 uVar4;
  int64_t local_8;
  
  uVar3 = 0;
  uVar4 = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<long,long,long>((long)in_RDI,3600000000,&local_8);
  if (!bVar2) {
    value = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Interval value %s hours out of range",&local_39);
    NumericHelper::ToString<long>(value);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              ((OutOfRangeException *)CONCAT44(uVar4,uVar3),in_RDI,in_stack_ffffffffffffffe0);
    __cxa_throw(value,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  iVar1.days = uVar4;
  iVar1.months = uVar3;
  iVar1.micros = local_8;
  return iVar1;
}

Assistant:

static inline TR Operation(TA input) {
		interval_t result;
		result.months = 0;
		result.days = 0;
		if (!TryMultiplyOperator::Operation<TA, int64_t, int64_t>(input, Interval::MICROS_PER_HOUR, result.micros)) {
			throw OutOfRangeException("Interval value %s hours out of range", NumericHelper::ToString(input));
		}
		return result;
	}